

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableAnalyzerSubprocess.cpp
# Opt level: O3

bool __thiscall
EnrichableAnalyzerSubprocess::GetScriptResponse
          (EnrichableAnalyzerSubprocess *this,char *outBuffer,uint outBufferLength,char *inBuffer,
          uint inBufferLength)

{
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  undefined4 uVar4;
  char *pcVar5;
  undefined1 *puVar6;
  
  uVar4 = SUB84(inBuffer,0);
  pcVar5 = outBuffer;
  uVar3 = pthread_mutex_lock((pthread_mutex_t *)&subprocessLock);
  uVar2 = SUB81(pcVar5,0);
  if (uVar3 == 0) {
    write(this->outpipefd[1],outBuffer,(ulong)outBufferLength);
    bVar1 = GetInputLine(this,inBuffer,inBufferLength);
    pthread_mutex_unlock((pthread_mutex_t *)&subprocessLock);
    return bVar1;
  }
  puVar6 = (undefined1 *)(ulong)uVar3;
  std::__throw_system_error(uVar3);
  *(undefined1 **)(puVar6 + 8) = puVar6 + 0x18;
  *(undefined8 *)(puVar6 + 0x10) = 0;
  puVar6[0x18] = 0;
  *puVar6 = uVar2;
  uVar2 = std::__cxx11::string::_M_assign((string *)(puVar6 + 8));
  *(undefined4 *)(puVar6 + 0x28) = uVar4;
  return (bool)uVar2;
}

Assistant:

bool EnrichableAnalyzerSubprocess::GetScriptResponse(
	const char* outBuffer,
	unsigned outBufferLength,
	char* inBuffer,
	unsigned inBufferLength
) {
	bool result;

	LockSubprocess();
	SendOutputLine(outBuffer, outBufferLength);
	result = GetInputLine(inBuffer, inBufferLength);
	UnlockSubprocess();

	return result;
}